

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_heap.c
# Opt level: O0

void vmcache_free(heap *heap,ptr_ext_t *first_extent)

{
  undefined1 local_48 [8];
  heap_entry he;
  extent ext;
  ptr_ext_t *__next;
  size_t freed;
  ptr_ext_t *first_extent_local;
  heap *heap_local;
  
  util_mutex_lock(&heap->lock);
  __next = (ptr_ext_t *)0x0;
  he.size = (size_t)first_extent;
  ext.ptr = (ptr_ext_t *)vmcache_extent_get_size(first_extent);
  ext.size = (size_t)vmcache_extent_get_next((ptr_ext_t *)he.size);
  while (he.size != 0) {
    __next = ext.ptr + (long)__next;
    vmcache_heap_merge(heap,(extent *)&he.size,(heap_entry *)local_48);
    vmcache_insert_heap_entry(heap,(heap_entry *)local_48,&heap->first_extent,0);
    he.size = ext.size;
    ext.ptr = (ptr_ext_t *)vmcache_extent_get_size((ptr_ext_t *)ext.size);
    ext.size = (size_t)vmcache_extent_get_next((ptr_ext_t *)ext.size);
  }
  heap->size_used = heap->size_used - (long)__next;
  util_mutex_unlock(&heap->lock);
  return;
}

Assistant:

void
vmcache_free(struct heap *heap, ptr_ext_t *first_extent)
{
	LOG(3, "heap %p first_extent %p", heap, first_extent);

	util_mutex_lock(&heap->lock);

	size_t freed = 0;

	/*
	 * EXTENTS_FOREACH_SAFE variant is required here,
	 * because vmcache_insert_heap_entry() can modify
	 * the headers of the 'ext' extent.
	 */
	ptr_ext_t *__next;
	struct extent ext;
	EXTENTS_FOREACH_SAFE(ext, first_extent, __next) {
		/* size without headers */
		freed += ext.size;

		struct heap_entry he;
		vmcache_heap_merge(heap, &ext, &he);
		vmcache_insert_heap_entry(heap,
					&he, &heap->first_extent, IS_FREE);
	}

#ifdef STATS_ENABLED
	heap->size_used -= freed;
#endif

	util_mutex_unlock(&heap->lock);
}